

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * xmlHashQLookup3(xmlHashTablePtr hash,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  xmlHashEntry *pxVar10;
  uint uVar11;
  
  if (hash == (xmlHashTablePtr)0x0) {
    return (void *)0x0;
  }
  if (name != (xmlChar *)0x0 && hash->size != 0) {
    uVar7 = hash->randomSeed;
    uVar2 = uVar7 ^ 0x3b00;
    uVar7 = uVar7 << 0xf | uVar7 >> 0x11;
    pbVar6 = name;
    pbVar5 = prefix;
    if (prefix != (xmlChar *)0x0) {
      for (; *pbVar5 != 0; pbVar5 = pbVar5 + 1) {
        uVar2 = (uVar2 + *pbVar5) * 9;
        uVar7 = ((uVar7 + uVar2) * 0x80 | uVar7 + uVar2 >> 0x19) * 5;
      }
      iVar3 = uVar2 * 9;
      uVar2 = uVar2 * 9 + 0x20a;
      uVar7 = iVar3 + uVar7 + 0x20a;
      uVar7 = (uVar7 * 0x80 | uVar7 >> 0x19) * 5;
    }
    for (; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
      uVar2 = (uVar2 + *pbVar6) * 9;
      uVar7 = ((uVar7 + uVar2) * 0x80 | uVar7 + uVar2 >> 0x19) * 5;
    }
    iVar3 = uVar2 * 9;
    iVar8 = ((uVar7 + iVar3) * 0x80 | uVar7 + iVar3 >> 0x19) * 5;
    pbVar6 = prefix2;
    if (prefix2 != (xmlChar *)0x0) {
      for (; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
        iVar3 = (iVar3 + (uint)*pbVar6) * 9;
        iVar8 = ((iVar8 + iVar3) * 0x80 | (uint)(iVar8 + iVar3) >> 0x19) * 5;
      }
      iVar1 = iVar3 * 9;
      iVar3 = iVar3 * 9 + 0x20a;
      uVar7 = iVar1 + iVar8 + 0x20a;
      iVar8 = (uVar7 * 0x80 | uVar7 >> 0x19) * 5;
    }
    pbVar6 = name2;
    if (name2 != (xmlChar *)0x0) {
      for (; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
        iVar3 = (iVar3 + (uint)*pbVar6) * 9;
        iVar8 = ((iVar8 + iVar3) * 0x80 | (uint)(iVar8 + iVar3) >> 0x19) * 5;
      }
    }
    uVar7 = iVar3 * 9;
    uVar2 = ((iVar8 + uVar7) * 0x80 | iVar8 + uVar7 >> 0x19) * 5;
    pbVar6 = prefix3;
    if (prefix3 != (xmlChar *)0x0) {
      for (; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
        uVar7 = (uVar7 + *pbVar6) * 9;
        uVar2 = ((uVar2 + uVar7) * 0x80 | uVar2 + uVar7 >> 0x19) * 5;
      }
      iVar3 = uVar7 * 9;
      uVar7 = uVar7 * 9 + 0x20a;
      uVar2 = iVar3 + uVar2 + 0x20a;
      uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) * 5;
    }
    pbVar6 = name3;
    if (name3 != (xmlChar *)0x0) {
      for (; *pbVar6 != 0; pbVar6 = pbVar6 + 1) {
        uVar7 = (uVar7 + *pbVar6) * 9;
        uVar2 = ((uVar2 + uVar7) * 0x80 | uVar2 + uVar7 >> 0x19) * 5;
      }
    }
    uVar4 = (uVar2 << 0xe | uVar2 >> 0x12) + (uVar7 ^ uVar2);
    uVar7 = (uVar4 * 0x4000000 | uVar4 >> 6) + (uVar2 ^ uVar4);
    uVar2 = (uVar7 * 0x20 | uVar7 >> 0x1b) + (uVar4 ^ uVar7);
    uVar11 = (uVar2 * 0x1000000 | uVar2 >> 8) + (uVar7 ^ uVar2);
    uVar4 = hash->size - 1;
    uVar2 = uVar11 & uVar4;
    uVar7 = hash->table[uVar2].hashValue;
    if (uVar7 == 0) {
      return (void *)0x0;
    }
    pxVar10 = hash->table + uVar2;
    uVar9 = 0;
    do {
      uVar2 = uVar2 + 1;
      if (((((uVar11 | 0x80000000) == uVar7) &&
           (iVar3 = xmlStrQEqual(prefix,name,pxVar10->key), iVar3 != 0)) &&
          (iVar3 = xmlStrQEqual(prefix2,name2,pxVar10->key2), iVar3 != 0)) &&
         (iVar3 = xmlStrQEqual(prefix3,name3,pxVar10->key3), iVar3 != 0)) {
        return pxVar10->payload;
      }
      if ((uVar2 & uVar4) == 0) {
        pxVar10 = hash->table;
      }
      else {
        pxVar10 = pxVar10 + 1;
      }
      uVar7 = pxVar10->hashValue;
    } while ((uVar7 != 0) && (uVar9 = uVar9 + 1, uVar9 <= (uVar2 - uVar7 & uVar4)));
  }
  return (void *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
void *
xmlHashQLookup3(xmlHashTablePtr hash,
                const xmlChar *prefix, const xmlChar *name,
                const xmlChar *prefix2, const xmlChar *name2,
                const xmlChar *prefix3, const xmlChar *name3) {
    const xmlHashEntry *entry;
    unsigned hashValue, mask, pos, displ;

    if ((hash == NULL) || (hash->size == 0) || (name == NULL))
        return(NULL);

    hashValue = xmlHashQNameValue(hash->randomSeed, prefix, name, prefix2,
                                  name2, prefix3, name3);
    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if ((hashValue == entry->hashValue) &&
                (xmlStrQEqual(prefix, name, entry->key)) &&
                (xmlStrQEqual(prefix2, name2, entry->key2)) &&
                (xmlStrQEqual(prefix3, name3, entry->key3)))
                return(entry->payload);

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    return(NULL);
}